

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

void trial::protocol::serialization::
     save_overloader<trial::protocol::bintoken::oarchive,_std::set<int,_std::less<int>,_std::allocator<int>_>,_void>
     ::save(oarchive *ar,set<int,_std::less<int>,_std::allocator<int>_> *data,uint protocol_version)

{
  bool bVar1;
  reference data_00;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  uint protocol_version_local;
  set<int,_std::less<int>,_std::allocator<int>_> *data_local;
  oarchive *ar_local;
  
  it._M_node._4_4_ = protocol_version;
  bintoken::oarchive::save<trial::protocol::bintoken::token::begin_array>(ar);
  bintoken::oarchive::save<trial::protocol::bintoken::token::null>(ar);
  local_28._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(data);
  while( true ) {
    local_30._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(data);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    data_00 = std::_Rb_tree_const_iterator<int>::operator*(&local_28);
    bintoken::oarchive::save_override<int>(ar,data_00,(ulong)it._M_node._4_4_);
    std::_Rb_tree_const_iterator<int>::operator++(&local_28);
  }
  bintoken::oarchive::save<trial::protocol::bintoken::token::end_array>(ar);
  return;
}

Assistant:

static void save(protocol::bintoken::oarchive& ar,
                     const std::set<Key, Compare, Allocator>& data,
                     const unsigned int protocol_version)
    {
        ar.save<bintoken::token::begin_array>();
        ar.save<bintoken::token::null>();
        for (typename std::set<Key, Compare, Allocator>::const_iterator it = data.begin();
             it != data.end();
             ++it)
        {
            ar.save_override(*it, protocol_version);
        }
        ar.save<bintoken::token::end_array>();
    }